

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O3

int16_t av1_dc_quant_QTX(int qindex,int delta,aom_bit_depth_t bit_depth)

{
  uint uVar1;
  int16_t *piVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = qindex + delta;
  uVar1 = 0xff;
  if (uVar4 < 0xff) {
    uVar1 = uVar4;
  }
  uVar3 = 0;
  if (-1 < (int)uVar4) {
    uVar3 = uVar1;
  }
  if (bit_depth == AOM_BITS_8) {
    piVar2 = dc_qlookup_QTX;
  }
  else if (bit_depth == AOM_BITS_12) {
    piVar2 = dc_qlookup_12_QTX;
  }
  else {
    if (bit_depth != AOM_BITS_10) {
      return -1;
    }
    piVar2 = dc_qlookup_10_QTX;
  }
  return piVar2[uVar3];
}

Assistant:

int16_t av1_dc_quant_QTX(int qindex, int delta, aom_bit_depth_t bit_depth) {
  const int q_clamped = clamp(qindex + delta, 0, MAXQ);
  switch (bit_depth) {
    case AOM_BITS_8: return dc_qlookup_QTX[q_clamped];
    case AOM_BITS_10: return dc_qlookup_10_QTX[q_clamped];
    case AOM_BITS_12: return dc_qlookup_12_QTX[q_clamped];
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
}